

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 simd_test_avx2::c_imm_v64_shr_n_s8<6>(c_v64 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2[8] = 3;
  auVar2._0_8_ = 0x303030303030303;
  auVar2[9] = 3;
  auVar2[10] = 3;
  auVar2[0xb] = 3;
  auVar2[0xc] = 3;
  auVar2[0xd] = 3;
  auVar2[0xe] = 3;
  auVar2[0xf] = 3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64;
  auVar1 = vpsrlw_avx(auVar1,6);
  auVar1 = vpand_avx(auVar1,auVar2);
  auVar3[8] = 2;
  auVar3._0_8_ = 0x202020202020202;
  auVar3[9] = 2;
  auVar3[10] = 2;
  auVar3[0xb] = 2;
  auVar3[0xc] = 2;
  auVar3[0xd] = 2;
  auVar3[0xe] = 2;
  auVar3[0xf] = 2;
  auVar1 = vpsubb_avx(auVar1 ^ auVar3,auVar3);
  return (c_v64)auVar1._0_8_;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined s8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = a.s8[c] >> n;
  return t;
}